

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adhuff_common.c
# Opt level: O1

adh_node_t * adh_search_leaf_by_encoding(bit_array_t *bit_array)

{
  adh_node_t *paVar1;
  ulong uVar2;
  bool bVar3;
  
  uVar2 = (ulong)bit_array->length;
  bVar3 = adh_root_node != (adh_node_t *)0x0;
  paVar1 = adh_root_node;
  if (uVar2 != 0 && bVar3) {
    do {
      paVar1 = *(adh_node_t **)
                ((paVar1->bit_array).buffer +
                (ulong)(bit_array->buffer[uVar2 - 1] == '1') * 8 + -0x1a);
      bVar3 = paVar1 != (adh_node_t *)0x0;
      if ((long)uVar2 < 2) break;
      uVar2 = uVar2 - 1;
    } while (paVar1 != (adh_node_t *)0x0);
  }
  if (((!bVar3) || (paVar1->right != (adh_node *)0x0)) || (paVar1->left != (adh_node *)0x0)) {
    paVar1 = (adh_node_t *)0x0;
  }
  return paVar1;
}

Assistant:

adh_node_t* adh_search_leaf_by_encoding(const bit_array_t *bit_array) {
    adh_node_t* nextNode = adh_root_node;
    for(int i = bit_array->length-1; i >= 0 && nextNode; i--) {
        if(bit_array->buffer[i] == BIT_1) {
            nextNode = nextNode->right;
        } else
            nextNode = nextNode->left;
    }

    // if it's a leaf return it
    if(nextNode && nextNode->right == NULL && nextNode->left == NULL)
        return nextNode;

    return NULL;
}